

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

int Kit_DsdCountAigNodes_rec(Kit_DsdNtk_t *pNtk,int Id)

{
  Kit_DsdObj_t KVar1;
  int iVar2;
  Kit_DsdObj_t *pKVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  
  pKVar3 = Kit_DsdNtkObj(pNtk,Id);
  iVar7 = 0;
  if (pKVar3 != (Kit_DsdObj_t *)0x0) {
    KVar1 = *pKVar3;
    uVar4 = (uint)KVar1 >> 6 & 7;
    if ((1 < uVar4 - 1) && (iVar7 = 0, 0x7ffffff < (uint)KVar1)) {
      uVar6 = (uint)KVar1 >> 0x1a;
      if (uVar4 == 5) {
        if (uVar6 != 3) {
          __assert_fail("(int)pObj->nFans == 3",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                        ,0x743,"int Kit_DsdCountAigNodes_rec(Kit_DsdNtk_t *, int)");
        }
        iVar7 = 3;
      }
      else if (uVar4 == 4) {
        iVar7 = uVar6 * 3 + -3;
      }
      else {
        if (uVar4 != 3) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                        ,0x746,"int Kit_DsdCountAigNodes_rec(Kit_DsdNtk_t *, int)");
        }
        iVar7 = uVar6 - 1;
      }
      for (uVar5 = 0; uVar5 < (uint)KVar1 >> 0x1a; uVar5 = uVar5 + 1) {
        iVar2 = Abc_Lit2Var((uint)*(ushort *)(&pKVar3[1].field_0x0 + uVar5 * 2));
        iVar2 = Kit_DsdCountAigNodes_rec(pNtk,iVar2);
        iVar7 = iVar7 + iVar2;
        KVar1 = *pKVar3;
      }
    }
  }
  return iVar7;
}

Assistant:

int Kit_DsdCountAigNodes_rec( Kit_DsdNtk_t * pNtk, int Id )
{
    Kit_DsdObj_t * pObj;
    unsigned iLit, i, RetValue;
    pObj = Kit_DsdNtkObj( pNtk, Id );
    if ( pObj == NULL )
        return 0;
    if ( pObj->Type == KIT_DSD_CONST1 || pObj->Type == KIT_DSD_VAR )
        return 0;
    if ( pObj->nFans < 2 ) // why this happens? - need to figure out
        return 0; 
    assert( pObj->nFans > 1 );
    if ( pObj->Type == KIT_DSD_AND )
        RetValue = ((int)pObj->nFans - 1);
    else if ( pObj->Type == KIT_DSD_XOR )
        RetValue = ((int)pObj->nFans - 1) * 3;
    else if ( pObj->Type == KIT_DSD_PRIME )
    {
        // assuming MUX decomposition
        assert( (int)pObj->nFans == 3 );
        RetValue = 3;
    }
    else assert( 0 );
    Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        RetValue += Kit_DsdCountAigNodes_rec( pNtk, Abc_Lit2Var(iLit) );
    return RetValue;
}